

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::expand<double>(Omega_h *this,Read<signed_char> *a_data,LOs *a2b,Int width)

{
  int size_in;
  char *file;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<double> local_140;
  Write<double> local_130;
  Read<int> local_120;
  Read<double> local_110;
  allocator local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Write<signed_char> b_data;
  __cxx11 local_c0 [4];
  int nb;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [35];
  ScopedTimer local_25;
  Int local_24;
  ScopedTimer omega_h_scoped_function_timer;
  LOs *pLStack_20;
  Int width_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  
  local_24 = width;
  pLStack_20 = a2b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_89);
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::to_string(local_c0,0x7b);
  std::operator+(local_48,local_68);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_25,"expand",file);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  b_data.shared_alloc_.direct_ptr._4_4_ = Read<int>::last(a2b);
  size_in = b_data.shared_alloc_.direct_ptr._4_4_ * local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",&local_f9);
  Write<double>::Write((Write<double> *)local_d8,size_in,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  Read<double>::Read(&local_110,(Read<double> *)a_data);
  Read<int>::Read(&local_120,a2b);
  Write<double>::Write(&local_130,(Write<double> *)local_d8);
  expand_into<double>((Read<signed_char> *)&local_110,&local_120,(Write<signed_char> *)&local_130,
                      local_24);
  Write<double>::~Write(&local_130);
  Read<int>::~Read(&local_120);
  Read<double>::~Read(&local_110);
  Write<double>::Write(&local_140,(Write<signed_char> *)local_d8);
  Read<double>::Read((Read<double> *)this,&local_140);
  Write<double>::~Write(&local_140);
  Write<double>::~Write((Write<double> *)local_d8);
  ScopedTimer::~ScopedTimer(&local_25);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> expand(Read<T> a_data, LOs a2b, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto nb = a2b.last();
  Write<T> b_data(nb * width);
  expand_into(a_data, a2b, b_data, width);
  return b_data;
}